

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O3

Vector * GMRESIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                  double OmegaPrecond)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  void *__ptr;
  LASErrIdType LVar4;
  Boolean BVar5;
  int iVar6;
  void *__ptr_00;
  void *pvVar7;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  size_t Dim;
  Vector *__ptr_04;
  Vector *pVVar8;
  Vector *pVVar9;
  Vector *pVVar10;
  int iVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  size_t __size;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  double bNorm;
  double dVar22;
  double dVar23;
  double dVar24;
  char vName [10];
  char local_3a [10];
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  iVar17 = GMRESSteps;
  uVar21 = (ulong)(uint)GMRESSteps;
  lVar18 = (long)GMRESSteps;
  uVar19 = GMRESSteps + 1;
  __size = (long)(int)uVar19 << 3;
  __ptr_00 = malloc(__size);
  if (__ptr_00 == (void *)0x0) {
    bVar12 = true;
  }
  else {
    bVar12 = false;
    if (0 < iVar17) {
      bVar12 = true;
      uVar20 = 1;
      do {
        pvVar7 = malloc(uVar21 * 8 + 0x10);
        *(void **)((long)__ptr_00 + uVar20 * 8) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          bVar12 = false;
        }
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
      bVar12 = !bVar12;
    }
  }
  pvVar7 = malloc(__size);
  __ptr_01 = malloc(lVar18 * 8 + 0x10);
  __ptr_02 = malloc(__size);
  __ptr_03 = malloc(__size);
  Dim = Q_GetDim(A);
  iVar17 = GMRESSteps;
  __ptr_04 = (Vector *)malloc((long)GMRESSteps * 0x30 + 0x60);
  if (__ptr_04 != (Vector *)0x0) {
    if (-1 < iVar17) {
      uVar21 = 1;
      lVar18 = 0;
      pVVar8 = __ptr_04;
      do {
        pVVar8 = pVVar8 + 1;
        sprintf(local_3a,"v[%d]",(ulong)((int)(uVar21 / 1000) * -1000 + (int)lVar18 + 1));
        V_Constr(pVVar8,local_3a,Dim,Normal,True);
        lVar18 = lVar18 + 1;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (lVar18 <= GMRESSteps);
    }
    if (((__ptr_03 != (void *)0x0 && __ptr_02 != (void *)0x0) &&
        (pvVar7 != (void *)0x0 && __ptr_01 != (void *)0x0)) && !bVar12) goto LAB_00107a87;
  }
  LASError(LASMemAllocErr,"GMRESIter",(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00107a87:
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar22 = l1Norm_V(x);
    if (2.2250738585072014e-307 <=
        ABS(dVar22 / (((double)CONCAT44(0x45300000,(int)(Dim >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar5 = Q_KerDefined(A);
      if (BVar5 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar8 = Mul_QV(A,x);
      pVVar8 = Sub_VV(b,pVVar8);
      Asgn_VV(__ptr_04 + 1,pVVar8);
    }
    else {
      Asgn_VV(__ptr_04 + 1,b);
    }
    pVVar8 = __ptr_04 + 1;
    dVar22 = l2Norm_V(pVVar8);
    iVar17 = 0;
    BVar5 = RTCResult(0,dVar22,bNorm,GMRESIterId);
    if (0 < MaxIter && BVar5 == False) {
LAB_00107ba1:
      if (PrecondProc != (PrecondProcType)0x0) {
        (*PrecondProc)(A,pVVar8,pVVar8,OmegaPrecond);
      }
      dVar22 = l2Norm_V(pVVar8);
      *(double *)((long)__ptr_01 + 8) = dVar22;
      MulAsgn_VS(pVVar8,1.0 / dVar22);
      uVar21 = 0;
      do {
        iVar11 = (int)uVar21;
        if (PrecondProc == (PrecondProcType)0x0) {
          BVar5 = RTCResult(iVar17,ABS(*(double *)((long)__ptr_01 + uVar21 * 8 + 8)),bNorm,
                            GMRESIterId);
          if (((BVar5 != False) || (GMRESSteps <= iVar11)) || (MaxIter <= iVar17))
          goto LAB_00107e69;
          uVar20 = (ulong)(iVar11 + 1);
          pVVar9 = Mul_QV(A,__ptr_04 + uVar20);
          Asgn_VV(__ptr_04 + uVar21 + 2,pVVar9);
        }
        else {
          if ((GMRESSteps <= iVar11) || (MaxIter <= iVar17)) goto LAB_00107e69;
          uVar20 = (ulong)(iVar11 + 1);
          pVVar9 = Mul_QV(A,__ptr_04 + uVar20);
          (*PrecondProc)(A,__ptr_04 + uVar21 + 2,pVVar9,OmegaPrecond);
        }
        uVar13 = 1;
        pVVar9 = pVVar8;
        do {
          dVar22 = Mul_VV(__ptr_04 + uVar21 + 2,pVVar9);
          lVar18 = *(long *)((long)__ptr_00 + uVar20 * 8);
          *(double *)(lVar18 + uVar13 * 8) = dVar22;
          pVVar10 = Mul_SV(dVar22,pVVar9);
          SubAsgn_VV(__ptr_04 + uVar21 + 2,pVVar10);
          uVar13 = uVar13 + 1;
          pVVar9 = pVVar9 + 1;
        } while ((int)uVar20 + 1 != uVar13);
        lVar16 = uVar21 + 2;
        dVar22 = l2Norm_V(__ptr_04 + lVar16);
        *(double *)(lVar18 + 0x10 + uVar21 * 8) = dVar22;
        MulAsgn_VS(__ptr_04 + lVar16,1.0 / dVar22);
        if (iVar11 != 0) {
          dVar22 = *(double *)(lVar18 + 8);
          uVar21 = 1;
          do {
            dVar2 = *(double *)((long)__ptr_03 + uVar21 * 8);
            dVar3 = *(double *)((long)__ptr_02 + uVar21 * 8);
            dVar24 = *(double *)(lVar18 + 8 + uVar21 * 8);
            dVar23 = dVar22 * dVar3;
            dVar22 = dVar22 * -dVar2 + dVar24 * dVar3;
            pdVar1 = (double *)(lVar18 + uVar21 * 8);
            *pdVar1 = dVar23 + dVar24 * dVar2;
            pdVar1[1] = dVar22;
            uVar21 = uVar21 + 1;
          } while (iVar11 + 1 != uVar21);
        }
        iVar17 = iVar17 + 1;
        dVar22 = *(double *)(lVar18 + uVar20 * 8);
        dVar2 = *(double *)(lVar18 + lVar16 * 8);
        dVar24 = SQRT(dVar22 * dVar22 + dVar2 * dVar2);
        *(double *)((long)__ptr_02 + uVar20 * 8) = dVar22 / dVar24;
        *(double *)((long)__ptr_03 + uVar20 * 8) = dVar2 / dVar24;
        *(double *)(lVar18 + uVar20 * 8) = dVar24;
        *(undefined8 *)(lVar18 + lVar16 * 8) = 0;
        dVar3 = *(double *)((long)__ptr_01 + uVar20 * 8);
        *(double *)((long)__ptr_01 + lVar16 * 8) = -(dVar2 / dVar24) * dVar3;
        *(double *)((long)__ptr_01 + uVar20 * 8) = (dVar22 / dVar24) * dVar3;
        uVar21 = uVar20;
      } while( true );
    }
  }
LAB_00107faf:
  if (__ptr_04 != (Vector *)0x0) {
    if (-1 < GMRESSteps) {
      lVar18 = 0;
      pVVar8 = __ptr_04;
      do {
        pVVar8 = pVVar8 + 1;
        V_Destr(pVVar8);
        lVar18 = lVar18 + 1;
      } while (lVar18 <= GMRESSteps);
    }
    free(__ptr_04);
  }
  if (__ptr_00 != (void *)0x0) {
    uVar21 = (ulong)(uint)GMRESSteps;
    if (0 < GMRESSteps) {
      lVar18 = 1;
      do {
        __ptr = *(void **)((long)__ptr_00 + lVar18 * 8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar18 = lVar18 + 1;
      } while (uVar21 + 1 != lVar18);
    }
    free(__ptr_00);
  }
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  if (__ptr_01 != (void *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_02 != (void *)0x0) {
    free(__ptr_02);
  }
  if (__ptr_03 != (void *)0x0) {
    free(__ptr_03);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
LAB_00107e69:
  if (0 < iVar11) {
    iVar6 = iVar11 + 1;
    uVar20 = uVar21;
    uVar13 = uVar21;
    do {
      uVar13 = uVar13 - 1;
      lVar18 = *(long *)((long)__ptr_00 + uVar20 * 8);
      dVar22 = *(double *)((long)__ptr_01 + uVar20 * 8) / *(double *)(lVar18 + uVar20 * 8);
      *(double *)((long)pvVar7 + uVar20 * 8) = dVar22;
      uVar14 = uVar13;
      iVar15 = iVar6;
      if (uVar20 < 2) break;
      do {
        lVar16 = (uVar14 & 0xffffffff) * 8;
        *(double *)((long)__ptr_01 + lVar16) =
             *(double *)((long)__ptr_01 + lVar16) - *(double *)(lVar18 + lVar16) * dVar22;
        iVar15 = iVar15 + -1;
        uVar14 = uVar14 - 1;
      } while (2 < iVar15);
      iVar6 = iVar6 + -1;
      bVar12 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar12);
    if (0 < iVar11) {
      uVar20 = uVar21 + 1;
      pVVar9 = __ptr_04 + uVar21;
      do {
        pVVar10 = Mul_SV(*(double *)((long)pvVar7 + uVar20 * 8 + -8),pVVar9);
        AddAsgn_VV(x,pVVar10);
        uVar20 = uVar20 - 1;
        pVVar9 = pVVar9 + -1;
      } while (1 < uVar20);
    }
  }
  BVar5 = Q_KerDefined(A);
  if (BVar5 != False) {
    OrthoRightKer_VQ(x,A);
  }
  pVVar9 = Mul_QV(A,x);
  pVVar9 = Sub_VV(b,pVVar9);
  Asgn_VV(pVVar8,pVVar9);
  dVar22 = l2Norm_V(pVVar8);
  BVar5 = RTCResult(iVar17,dVar22,bNorm,GMRESIterId);
  if ((BVar5 != False) || (MaxIter <= iVar17)) goto LAB_00107faf;
  goto LAB_00107ba1;
}

Assistant:

Vector *GMRESIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    char vName[10];
    int Iter, i, j, k;
    double h1, h2, r;
    double bNorm;
    double **h, *y, *s, *c1, *c2;
    size_t Dim;
    Boolean AllocOK;
    Vector *v;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    /* allocation of matrix H and vectors y, s, c1 and c2 */
    AllocOK = True;
    h = (double **)malloc((GMRESSteps + 1) * sizeof(double *));
    if (h == NULL) {
        AllocOK = False;
    } else {
        for (i = 1; i <= GMRESSteps; i++) {
            h[i] = (double *)malloc((GMRESSteps + 2) * sizeof(double));
            if (h[i] == NULL)
                AllocOK = False;
	}
    }
    y = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (y == NULL)
        AllocOK = False;
    s = (double *)malloc((GMRESSteps + 2) * sizeof(double));
    if (s == NULL)
        AllocOK = False;
    c1 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c1 == NULL)
        AllocOK = False;
    c2 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c2 == NULL)
        AllocOK = False;

    /* ... and vectors u */    
    Dim = Q_GetDim(A);
    v = (Vector *)malloc((GMRESSteps + 2) * sizeof(Vector));
    if (v == NULL)
        AllocOK = False;
    else
        for (i = 1; i <= GMRESSteps + 1; i++) {
	    sprintf(vName, "v[%d]", i % 1000);
            V_Constr(&v[i], vName, Dim, Normal, True);
	}

    if (!AllocOK)
        LASError(LASMemAllocErr, "GMRESIter", NULL, NULL, NULL);
        
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        /* loop for 'MaxIter' GMRES cycles */
        Iter = 0;
        /* v[1] = r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&v[1], b);
	}
        while (!RTCResult(Iter, l2Norm_V(&v[1]), bNorm, GMRESIterId)
            && Iter < MaxIter) {
            if (PrecondProc != NULL)
	        (*PrecondProc)(A, &v[1], &v[1], OmegaPrecond);
            s[1] = l2Norm_V(&v[1]);
            MulAsgn_VS(&v[1], 1.0 / s[1]);

            /* GMRES iteration */
            i = 0;
            while ((PrecondProc != NULL ? True : !RTCResult(Iter, fabs(s[i+1]),
                bNorm, GMRESIterId)) && i < GMRESSteps && Iter < MaxIter) {
 	        i++;
		Iter++;
                /* w = v[i+1] */
                if (PrecondProc != NULL) 
		    (*PrecondProc)(A, &v[i+1], Mul_QV(A, &v[i]), OmegaPrecond);
                else
                    Asgn_VV(&v[i+1], Mul_QV(A, &v[i]));

                /* modified Gram-Schmidt orthogonalization */
                for (k = 1; k <= i; k++) {
                    h[i][k] = Mul_VV(&v[i+1], &v[k]);
                    SubAsgn_VV(&v[i+1], Mul_SV(h[i][k], &v[k]));
                }

                h[i][i+1] = l2Norm_V(&v[i+1]);
                MulAsgn_VS(&v[i+1], 1.0 / h[i][i+1]);

                /* Q-R algorithm */
                for (k = 1; k < i; k++) {
                    h1 = c1[k] * h[i][k] + c2[k] * h[i][k+1];
                    h2 = - c2[k] * h[i][k] + c1[k] * h[i][k+1];
                    h[i][k] = h1;
                    h[i][k+1] = h2;
                }
                r = sqrt(h[i][i] * h[i][i] + h[i][i+1] * h[i][i+1]);
                c1[i] = h[i][i] / r;
                c2[i] = h[i][i+1] / r;
                h[i][i] = r;
                h[i][i+1] = 0.0;
                s[i+1] = - c2[i] * s[i];
                s[i] = c1[i] * s[i];
            }

            /* Solving of the system of equations : H y = s */
            for (j = i; j > 0; j--) {
                y[j] = s[j] / h[j][j];
                for (k = j - 1; k > 0; k--)
                    s[k] -= h[j][k] * y[j];
            }

            /* updating solution */
            for (j = i; j > 0; j--)
                AddAsgn_VV(x, Mul_SV(y[j], &v[j]));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
                
            /* computing new residual */
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        }
    }

    /* release of vectors u, matrix H and vectors y, s, c1 and c2 */
    if (v != NULL) {
        for (i = 1; i <= GMRESSteps + 1; i++)
            V_Destr(&v[i]);
        free(v);
    }

    if (h != NULL) {
        for (i = 1; i <= GMRESSteps; i++)
	    if (h[i] != NULL)
                free(h[i]);
        free(h);
    }
    if (y != NULL)
        free(y);
    if (s != NULL)
        free(s);
    if (c1 != NULL)
        free(c1);
    if (c2 != NULL)
        free(c2);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}